

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::forward_int8_x86
          (ConvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  _func_int **pp_Var5;
  Layer *pLVar6;
  size_t sVar7;
  float fVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint _elempack;
  int iVar15;
  undefined8 uVar16;
  Option OVar17;
  undefined1 uVar18;
  _func_int **pp_Var19;
  _func_int *p_Var20;
  undefined4 *puVar21;
  long lVar22;
  ulong uVar23;
  float *pfVar24;
  void *pvVar25;
  int g;
  uint uVar26;
  uint uVar27;
  void *pvVar28;
  undefined1 *puVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  void *pvVar37;
  int iVar38;
  _Vector_base<float,_std::allocator<float>_> *p_Var39;
  long lVar40;
  undefined1 (*pauVar41) [16];
  undefined1 (*pauVar42) [16];
  float *pfVar43;
  long lVar44;
  int remain_1;
  int iVar45;
  long lVar46;
  void *pvVar47;
  int k;
  int iVar48;
  ulong uVar49;
  void *pvVar50;
  long lVar51;
  int g_1;
  ulong uVar52;
  ulong uVar53;
  float *pfVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  undefined4 uVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  __m128 pos;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  __m128 pos_1;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar116 [12];
  undefined1 in_ZMM4 [64];
  undefined1 auVar115 [64];
  __m128 max;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [64];
  undefined1 auVar138 [16];
  undefined1 in_ZMM8 [64];
  v4sf one;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [16];
  undefined1 auVar149 [64];
  ulong local_330;
  float *local_320;
  byte local_310;
  long local_2f8;
  Mat local_2d8;
  void *local_288;
  long local_280;
  ulong local_278;
  float *local_270;
  float top_rescale;
  int iStack_264;
  Allocator *pAStack_260;
  Allocator *pAStack_258;
  int iStack_250;
  undefined4 uStack_24c;
  Allocator *pAStack_248;
  int iStack_240;
  int iStack_23c;
  int iStack_238;
  int iStack_234;
  int iStack_230;
  undefined4 uStack_22c;
  size_t local_228;
  Option opt_q;
  float scale_out;
  undefined4 uStack_1b4;
  int *local_1b0;
  Allocator *local_1a8;
  int local_1a0;
  long *local_198;
  bool local_190;
  bool bStack_18f;
  bool bStack_18e;
  bool bStack_18d;
  bool bStack_18c;
  bool bStack_18b;
  bool bStack_18a;
  bool bStack_189;
  int iStack_188;
  bool bStack_184;
  bool bStack_183;
  bool bStack_182;
  bool bStack_181;
  int local_180;
  ulong local_178;
  pointer local_170;
  Mat local_168;
  Mat m_1;
  _Vector_base<float,_std::allocator<float>_> local_d8;
  _Vector_base<float,_std::allocator<float>_> local_c0;
  _Vector_base<float,_std::allocator<float>_> local_a8;
  _Vector_base<float,_std::allocator<float>_> local_90;
  Option opt_g;
  
  auVar56 = in_ZMM8._0_16_;
  pos_1 = in_ZMM4._0_16_;
  local_168.c = bottom_blob->c;
  local_168.elempack = bottom_blob->elempack;
  local_168.elemsize = bottom_blob->elemsize;
  pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
  p_Var20 = pp_Var19[-3];
  iVar48 = *(int *)(&this->field_0xd4 + (long)p_Var20);
  iVar31 = *(int *)(&this->field_0xd8 + (long)p_Var20);
  iVar30 = *(int *)(&this->field_0xdc + (long)p_Var20);
  iVar45 = *(int *)(&this->field_0xe0 + (long)p_Var20);
  piVar3 = bottom_blob->refcount;
  local_168.data = bottom_blob->data;
  local_168.refcount = bottom_blob->refcount;
  local_168.allocator = bottom_blob->allocator;
  local_168.dims = bottom_blob->dims;
  local_168.w = bottom_blob->w;
  local_168.h = bottom_blob->h;
  local_168.d = bottom_blob->d;
  local_168.cstep = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
    pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
  }
  if (local_168.elempack == 0 || ((int)local_168.elemsize * 8) / local_168.elempack != 8) {
    iVar32 = local_168.elempack * local_168.c;
    iVar34 = *(int *)(&this->field_0x108 + (long)pp_Var19[-3]);
    local_2d8.cstep = 0;
    local_2d8.data = (undefined4 *)0x0;
    local_2d8.refcount._0_4_ = 0;
    local_2d8.refcount._4_4_ = 0;
    local_2d8.elemsize = 0;
    local_2d8.elempack = 0;
    local_2d8.allocator = (Allocator *)0x0;
    local_2d8.dims = 0;
    local_2d8.w = 0;
    local_2d8.h = 0;
    local_2d8.d = 0;
    local_2d8.c = 0;
    lVar40 = 0;
    Mat::create(&local_2d8,iVar32,4,(Allocator *)0x0);
    iVar32 = iVar32 / iVar34;
    pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
    puVar21 = (undefined4 *)local_2d8.data;
    if (iVar32 < 1) {
      iVar32 = 0;
    }
    for (; lVar40 < *(int *)(&this->field_0x108 + (long)pp_Var19[-3]); lVar40 = lVar40 + 1) {
      uVar90 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)pp_Var19[-3]) + lVar40 * 4);
      iVar34 = iVar32;
      while (bVar55 = iVar34 != 0, iVar34 = iVar34 + -1, bVar55) {
        *puVar21 = uVar90;
        puVar21 = puVar21 + 1;
      }
    }
    opt_q._16_48_ = SUB6448(*opt,0x10);
    opt_q._0_8_ = SUB648(*opt,0);
    opt_q.blob_allocator = opt->workspace_allocator;
    in_ZMM4 = ZEXT1664((undefined1  [16])pos_1);
    in_ZMM8 = ZEXT1664(auVar56);
    quantize_to_int8(bottom_blob,&local_168,&local_2d8,&opt_q);
    piVar3 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_2d8.allocator == (Allocator *)0x0) {
          free(local_2d8.data);
        }
        else {
          (*(local_2d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
  }
  local_2d8.cstep = 0;
  local_2d8.data = (void *)0x0;
  local_2d8.refcount._0_4_ = 0;
  local_2d8.refcount._4_4_ = 0;
  local_2d8.elemsize = 0;
  local_2d8.elempack = 0;
  local_2d8.allocator = (Allocator *)0x0;
  local_2d8.dims = 0;
  local_2d8.w = 0;
  local_2d8.h = 0;
  local_2d8.d = 0;
  local_2d8.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx512 + (long)pp_Var19[-3]),&local_168,
             &local_2d8,opt);
  iVar33 = local_2d8.c;
  iVar15 = local_2d8.w;
  iVar32 = local_2d8.elempack;
  iVar34 = -100;
  if ((local_2d8.data == (void *)0x0) || (local_2d8.cstep * (long)local_2d8.c == 0))
  goto LAB_003e0384;
  p_Var20 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
  iVar30 = (~((iVar48 + -1) * iVar30) + local_2d8.w) / *(int *)(&this->field_0xe4 + (long)p_Var20);
  iVar48 = (~((iVar31 + -1) * iVar45) + local_2d8.h) / *(int *)(&this->field_0xe8 + (long)p_Var20);
  iVar31 = iVar30 + 1;
  iVar45 = iVar48 + 1;
  uVar26 = local_2d8.elempack * local_2d8.c;
  if ((uVar26 == *(uint *)(&this->field_0x108 + (long)p_Var20)) &&
     (uVar26 == *(uint *)(&this->field_0xd0 + (long)p_Var20))) {
    sVar7 = 8;
    if (opt->use_packing_layout == false) {
      sVar7 = 1;
    }
    if ((uVar26 & 7) != 0) {
      sVar7 = 1;
    }
    iVar2 = *(int *)(&this->field_0x10c + (long)p_Var20);
    iVar38 = (int)sVar7;
    uVar53 = (ulong)(uint)(iVar38 * 4);
    if (100 < iVar2) {
      uVar53 = sVar7;
    }
    Mat::create(top_blob,iVar31,iVar45,(int)uVar26 / iVar38,uVar53,iVar38,opt->blob_allocator);
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_003e0384;
    if (iVar32 == 1) {
      pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
      p_Var20 = pp_Var19[-3];
      iVar31 = *(int *)(&this->field_0xd8 + (long)p_Var20);
      if (iVar31 == 3 && *(int *)(&this->field_0xd4 + (long)p_Var20) == 3) {
        if ((((*(int *)(&this->field_0xe4 + (long)p_Var20) == 1) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var20) == 1)) &&
            (*(int *)(&this->field_0xdc + (long)p_Var20) == 1)) &&
           ((*(int *)(&this->field_0xe0 + (long)p_Var20) == 1 &&
            (*(uint *)(&this->field_0x110 + (long)p_Var20) < 2)))) {
          if (iVar2 < 0x65) {
            opt_q.workspace_allocator = (Allocator *)0x0;
            opt_q = (Option)(ZEXT4864((undefined1  [48])opt_q._16_48_) << 0x80);
            lVar40 = 0;
            while( true ) {
              auVar116 = in_ZMM4._4_12_;
              p_Var20 = pp_Var19[-3];
              if (*(int *)(&this->field_0x108 + (long)p_Var20) <= lVar40) break;
              _top_rescale = (void *)CONCAT44(iStack_264,
                                              1.0 / (*(float *)(*(long *)(&this->field_0x1f8 +
                                                                         (long)p_Var20) + lVar40 * 4
                                                               ) *
                                                    *(float *)(*(long *)(&this->field_0x240 +
                                                                        (long)p_Var20) + lVar40 * 4)
                                                    ));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              lVar40 = lVar40 + 1;
              pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_a8,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar48 = top_blob->w;
            iVar31 = top_blob->h;
            pvVar4 = (this->weight_data_tm).data;
            lVar40 = *(long *)(&this->field_0x1b0 + (long)p_Var20);
            iVar30 = top_blob->d;
            local_270 = (float *)top_blob->data;
            local_278 = top_blob->elemsize;
            local_280 = top_blob->cstep * local_278;
            lVar44 = (long)iVar31 * (long)iVar48;
            iVar45 = 0;
            if (0 < iVar31) {
              iVar45 = iVar31;
            }
            iVar31 = top_blob->dims;
            local_288 = (void *)CONCAT44(local_288._4_4_,iVar31);
            uVar53 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar53 = 0;
            }
            pfVar43 = local_270;
            for (uVar36 = 0; uVar36 != uVar53; uVar36 = uVar36 + 1) {
              iVar34 = (int)((local_278 * lVar44 + 0xf & 0xfffffffffffffff0) / local_278);
              if (iVar31 == 4) {
                iVar34 = (int)lVar44;
              }
              if (lVar40 == 0) {
                fVar87 = 0.0;
              }
              else {
                fVar87 = *(float *)(lVar40 + uVar36 * 4);
              }
              fVar86 = local_a8._M_impl.super__Vector_impl_data._M_start[uVar36];
              iVar34 = iVar34 * iVar30;
              if (iVar34 < 1) {
                iVar34 = 0;
              }
              for (lVar51 = 0; iVar34 != (int)lVar51; lVar51 = lVar51 + 1) {
                pfVar43[lVar51] = fVar87;
              }
              pvVar28 = (void *)(local_2d8.elemsize * local_2d8.cstep * uVar36 +
                                (long)local_2d8.data);
              lVar51 = (long)local_2d8.w + (long)pvVar28;
              pvVar50 = (void *)((long)local_2d8.w * 2 + (long)pvVar28);
              pfVar54 = (float *)(local_280 * uVar36 + (long)local_270);
              for (iVar34 = 0; iVar34 != iVar45; iVar34 = iVar34 + 1) {
                lVar22 = 0;
                pfVar24 = pfVar54;
                for (iVar32 = iVar48; 0 < iVar32; iVar32 = iVar32 + -1) {
                  auVar56 = vpinsrb_avx(ZEXT216(*(ushort *)((long)pvVar28 + lVar22)),
                                        (uint)*(byte *)((long)pvVar28 + lVar22 + 2),2);
                  auVar56 = vpinsrb_avx(auVar56,(uint)*(byte *)(lVar51 + lVar22),3);
                  auVar56 = vpinsrb_avx(auVar56,(uint)*(byte *)(lVar51 + 1 + lVar22),4);
                  auVar56 = vpinsrb_avx(auVar56,(uint)*(byte *)(lVar51 + 2 + lVar22),5);
                  auVar56 = vpinsrb_avx(auVar56,(uint)*(byte *)((long)pvVar50 + lVar22),6);
                  auVar56 = vpinsrb_avx(auVar56,(uint)*(byte *)((long)pvVar50 + lVar22 + 1),7);
                  auVar82._8_8_ = 0;
                  auVar82._0_8_ = *(ulong *)((long)pvVar4 + uVar36 * 9);
                  auVar57 = vpmovsxbw_avx(auVar82);
                  auVar56 = vpmovsxbw_avx(auVar56);
                  auVar56 = vpmaddwd_avx(auVar57,auVar56);
                  auVar56 = vphaddd_avx((undefined1  [16])0x0,auVar56);
                  auVar56 = vphaddd_avx(auVar56,auVar56);
                  auVar56 = vphaddd_avx(auVar56,auVar56);
                  auVar92._0_4_ =
                       (float)(auVar56._0_4_ +
                              (int)*(char *)((long)pvVar4 + uVar36 * 9 + 8) *
                              (int)*(char *)((long)pvVar50 + lVar22 + 2));
                  auVar92._4_12_ = auVar116;
                  auVar56 = vfmadd213ss_fma(auVar92,ZEXT416((uint)fVar86),
                                            ZEXT416((uint)pfVar54[lVar22]));
                  pfVar54[lVar22] = auVar56._0_4_;
                  pfVar24 = pfVar24 + 1;
                  lVar22 = lVar22 + 1;
                }
                pvVar28 = (void *)((long)pvVar28 + lVar22 + 2);
                lVar51 = lVar51 + lVar22 + 2;
                pvVar50 = (void *)((long)pvVar50 + lVar22 + 2);
                pfVar54 = pfVar24;
              }
              pfVar43 = (float *)((long)pfVar43 + local_280);
            }
            p_Var39 = &local_a8;
LAB_003e0c0a:
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(p_Var39);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      ((_Vector_base<float,_std::allocator<float>_> *)&opt_q);
          }
          else {
            opt_q._0_24_ = ZEXT1624((undefined1  [16])0x0);
            lVar40 = 0;
            while( true ) {
              auVar116 = in_ZMM8._4_12_;
              p_Var20 = pp_Var19[-3];
              if (*(int *)(&this->field_0x108 + (long)p_Var20) <= lVar40) break;
              fVar87 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var20) + lVar40 * 4);
              fVar86 = 0.0;
              if (fVar87 != 0.0) {
                fVar86 = 1.0 / (fVar87 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var20) +
                                                   lVar40 * 4));
              }
              _top_rescale = (void *)CONCAT44(iStack_264,fVar86);
              _scale_out = (void *)CONCAT44(uStack_1b4,
                                            *(undefined4 *)
                                             (*(long *)(&this->field_0x288 + (long)p_Var20) +
                                             lVar40 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&scale_out);
              lVar40 = lVar40 + 1;
              pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_90,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar48 = top_blob->w;
            pvVar4 = (this->weight_data_tm).data;
            lVar40 = *(long *)(&this->field_0x1b0 + (long)p_Var20);
            uVar53 = 0;
            iVar31 = top_blob->h;
            if (top_blob->h < 1) {
              iVar31 = 0;
            }
            uVar36 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar36 = uVar53;
            }
            auVar67._8_4_ = 0x3effffff;
            auVar67._0_8_ = 0x3effffff3effffff;
            auVar67._12_4_ = 0x3effffff;
            auVar66._8_4_ = 0x80000000;
            auVar66._0_8_ = 0x8000000080000000;
            auVar66._12_4_ = 0x80000000;
            for (; uVar53 != uVar36; uVar53 = uVar53 + 1) {
              if (lVar40 == 0) {
                auVar56 = ZEXT816(0) << 0x40;
              }
              else {
                auVar56 = ZEXT416(*(uint *)(lVar40 + uVar53 * 4));
              }
              pvVar47 = (void *)(top_blob->cstep * uVar53 * top_blob->elemsize +
                                (long)top_blob->data);
              fVar87 = local_90._M_impl.super__Vector_impl_data._M_start[uVar53 * 2];
              fVar86 = local_90._M_impl.super__Vector_impl_data._M_start[uVar53 * 2 + 1];
              pvVar28 = (void *)(local_2d8.cstep * uVar53 * local_2d8.elemsize +
                                (long)local_2d8.data);
              lVar44 = (long)pvVar28 + (long)local_2d8.w;
              pvVar50 = (void *)((long)pvVar28 + (long)local_2d8.w * 2);
              for (iVar30 = 0; iVar30 != iVar31; iVar30 = iVar30 + 1) {
                lVar51 = 0;
                for (iVar45 = iVar48; 0 < iVar45; iVar45 = iVar45 + -1) {
                  auVar57 = vpinsrb_avx(ZEXT216(*(ushort *)((long)pvVar28 + lVar51)),
                                        (uint)*(byte *)((long)pvVar28 + lVar51 + 2),2);
                  auVar57 = vpinsrb_avx(auVar57,(uint)*(byte *)(lVar44 + lVar51),3);
                  auVar57 = vpinsrb_avx(auVar57,(uint)*(byte *)(lVar44 + 1 + lVar51),4);
                  auVar57 = vpinsrb_avx(auVar57,(uint)*(byte *)(lVar44 + 2 + lVar51),5);
                  auVar57 = vpinsrb_avx(auVar57,(uint)*(byte *)((long)pvVar50 + lVar51),6);
                  auVar57 = vpinsrb_avx(auVar57,(uint)*(byte *)((long)pvVar50 + lVar51 + 1),7);
                  auVar62._8_8_ = 0;
                  auVar62._0_8_ = *(ulong *)((long)pvVar4 + uVar53 * 9);
                  auVar58 = vpmovsxbw_avx(auVar62);
                  auVar57 = vpmovsxbw_avx(auVar57);
                  auVar57 = vpmaddwd_avx(auVar58,auVar57);
                  auVar57 = vphaddd_avx((undefined1  [16])0x0,auVar57);
                  auVar57 = vphaddd_avx(auVar57,auVar57);
                  auVar57 = vphaddd_avx(auVar57,auVar57);
                  auVar63._0_4_ =
                       (float)(auVar57._0_4_ +
                              (int)*(char *)((long)pvVar4 + uVar53 * 9 + 8) *
                              (int)*(char *)((long)pvVar50 + lVar51 + 2));
                  auVar63._4_12_ = auVar116;
                  auVar57 = vfmadd213ss_fma(auVar63,ZEXT416((uint)fVar87),auVar56);
                  fVar8 = auVar57._0_4_ * fVar86;
                  auVar57 = vpternlogd_avx512vl(auVar67,ZEXT416((uint)fVar8),auVar66,0xf8);
                  auVar57 = ZEXT416((uint)(fVar8 + auVar57._0_4_));
                  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
                  iVar34 = (int)auVar57._0_4_;
                  if (iVar34 < -0x7e) {
                    iVar34 = -0x7f;
                  }
                  uVar18 = (undefined1)iVar34;
                  if (0x7e < iVar34) {
                    uVar18 = 0x7f;
                  }
                  *(undefined1 *)((long)pvVar47 + lVar51) = uVar18;
                  lVar51 = lVar51 + 1;
                }
                pvVar28 = (void *)((long)pvVar28 + lVar51 + 2);
                lVar44 = lVar44 + lVar51 + 2;
                pvVar50 = (void *)((long)pvVar50 + lVar51 + 2);
                pvVar47 = (void *)((long)pvVar47 + lVar51);
              }
            }
            p_Var39 = &local_90;
LAB_003e0e21:
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(p_Var39);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      ((_Vector_base<float,_std::allocator<float>_> *)&opt_q);
          }
          iVar34 = 0;
          pLVar6 = this->activation;
          if (pLVar6 != (Layer *)0x0) {
            (*pLVar6->_vptr_Layer[9])(pLVar6,top_blob,opt);
          }
          goto LAB_003e0384;
        }
        iVar31 = 3;
        if ((((*(int *)(&this->field_0xdc + (long)p_Var20) == 1) &&
             ((*(int *)(&this->field_0xe0 + (long)p_Var20) == 1 &&
              (*(int *)(&this->field_0xe4 + (long)p_Var20) == 2)))) &&
            (*(int *)(&this->field_0xe8 + (long)p_Var20) == 2)) &&
           (*(uint *)(&this->field_0x110 + (long)p_Var20) < 2)) {
          if (100 < iVar2) {
            opt_q._0_24_ = ZEXT1624((undefined1  [16])0x0);
            lVar40 = 0;
            while( true ) {
              auVar116 = in_ZMM8._4_12_;
              p_Var20 = pp_Var19[-3];
              if (*(int *)(&this->field_0x108 + (long)p_Var20) <= lVar40) break;
              fVar87 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var20) + lVar40 * 4);
              fVar86 = 0.0;
              if (fVar87 != 0.0) {
                fVar86 = 1.0 / (fVar87 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var20) +
                                                   lVar40 * 4));
              }
              _top_rescale = (void *)CONCAT44(iStack_264,fVar86);
              _scale_out = (void *)CONCAT44(uStack_1b4,
                                            *(undefined4 *)
                                             (*(long *)(&this->field_0x288 + (long)p_Var20) +
                                             lVar40 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&scale_out);
              lVar40 = lVar40 + 1;
              pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_c0,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar48 = top_blob->w;
            pvVar4 = (this->weight_data_tm).data;
            lVar40 = *(long *)(&this->field_0x1b0 + (long)p_Var20);
            lVar44 = (long)((local_2d8.w - iVar48) * 2);
            uVar53 = 0;
            iVar31 = top_blob->h;
            if (top_blob->h < 1) {
              iVar31 = 0;
            }
            uVar36 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar36 = uVar53;
            }
            auVar58._8_4_ = 0x3effffff;
            auVar58._0_8_ = 0x3effffff3effffff;
            auVar58._12_4_ = 0x3effffff;
            auVar59._8_4_ = 0x80000000;
            auVar59._0_8_ = 0x8000000080000000;
            auVar59._12_4_ = 0x80000000;
            for (; uVar53 != uVar36; uVar53 = uVar53 + 1) {
              if (lVar40 == 0) {
                auVar56 = ZEXT816(0) << 0x40;
              }
              else {
                auVar56 = ZEXT416(*(uint *)(lVar40 + uVar53 * 4));
              }
              puVar29 = (undefined1 *)
                        (top_blob->cstep * uVar53 * top_blob->elemsize + (long)top_blob->data);
              fVar87 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar53 * 2];
              fVar86 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar53 * 2 + 1];
              pvVar28 = (void *)(local_2d8.cstep * uVar53 * local_2d8.elemsize +
                                (long)local_2d8.data);
              lVar51 = (long)pvVar28 + (long)local_2d8.w;
              pvVar50 = (void *)((long)pvVar28 + (long)local_2d8.w * 2);
              for (iVar30 = 0; iVar30 != iVar31; iVar30 = iVar30 + 1) {
                lVar22 = 0;
                for (iVar45 = iVar48; 0 < iVar45; iVar45 = iVar45 + -1) {
                  auVar57 = vpinsrb_avx(ZEXT216(*(ushort *)((long)pvVar28 + lVar22)),
                                        (uint)*(byte *)((long)pvVar28 + lVar22 + 2),2);
                  auVar57 = vpinsrb_avx(auVar57,(uint)*(byte *)(lVar51 + lVar22),3);
                  auVar57 = vpinsrb_avx(auVar57,(uint)*(byte *)(lVar51 + 1 + lVar22),4);
                  auVar57 = vpinsrb_avx(auVar57,(uint)*(byte *)(lVar51 + 2 + lVar22),5);
                  auVar57 = vpinsrb_avx(auVar57,(uint)*(byte *)((long)pvVar50 + lVar22),6);
                  auVar57 = vpinsrb_avx(auVar57,(uint)*(byte *)((long)pvVar50 + lVar22 + 1),7);
                  auVar60._8_8_ = 0;
                  auVar60._0_8_ = *(ulong *)((long)pvVar4 + uVar53 * 9);
                  auVar60 = vpmovsxbw_avx(auVar60);
                  auVar57 = vpmovsxbw_avx(auVar57);
                  auVar57 = vpmaddwd_avx(auVar60,auVar57);
                  auVar57 = vphaddd_avx((undefined1  [16])0x0,auVar57);
                  auVar57 = vphaddd_avx(auVar57,auVar57);
                  auVar57 = vphaddd_avx(auVar57,auVar57);
                  auVar61._0_4_ =
                       (float)(auVar57._0_4_ +
                              (int)*(char *)((long)pvVar4 + uVar53 * 9 + 8) *
                              (int)*(char *)((long)pvVar50 + lVar22 + 2));
                  auVar61._4_12_ = auVar116;
                  auVar57 = vfmadd213ss_fma(auVar61,ZEXT416((uint)fVar87),auVar56);
                  fVar8 = auVar57._0_4_ * fVar86;
                  auVar57 = vpternlogd_avx512vl(auVar58,ZEXT416((uint)fVar8),auVar59,0xf8);
                  auVar57 = ZEXT416((uint)(fVar8 + auVar57._0_4_));
                  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
                  iVar34 = (int)auVar57._0_4_;
                  if (iVar34 < -0x7e) {
                    iVar34 = -0x7f;
                  }
                  uVar18 = (undefined1)iVar34;
                  if (0x7e < iVar34) {
                    uVar18 = 0x7f;
                  }
                  *puVar29 = uVar18;
                  puVar29 = puVar29 + 1;
                  lVar22 = lVar22 + 2;
                }
                pvVar28 = (void *)((long)pvVar28 + lVar22 + lVar44);
                lVar51 = lVar51 + lVar44 + lVar22;
                pvVar50 = (void *)((long)pvVar50 + lVar22 + lVar44);
              }
            }
            p_Var39 = &local_c0;
            goto LAB_003e0e21;
          }
          opt_q.workspace_allocator = (Allocator *)0x0;
          opt_q = (Option)(ZEXT4864((undefined1  [48])opt_q._16_48_) << 0x80);
          lVar40 = 0;
          while( true ) {
            auVar116 = in_ZMM4._4_12_;
            p_Var20 = pp_Var19[-3];
            if (*(int *)(&this->field_0x108 + (long)p_Var20) <= lVar40) break;
            _top_rescale = (void *)CONCAT44(iStack_264,
                                            1.0 / (*(float *)(*(long *)(&this->field_0x1f8 +
                                                                       (long)p_Var20) + lVar40 * 4)
                                                  * *(float *)(*(long *)(&this->field_0x240 +
                                                                        (long)p_Var20) + lVar40 * 4)
                                                  ));
            std::vector<float,_std::allocator<float>_>::push_back
                      ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
            lVar40 = lVar40 + 1;
            pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
          }
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_d8,
                     (vector<float,_std::allocator<float>_> *)&opt_q);
          iVar48 = top_blob->w;
          iVar31 = top_blob->h;
          pvVar4 = (this->weight_data_tm).data;
          lVar40 = *(long *)(&this->field_0x1b0 + (long)p_Var20);
          iVar30 = top_blob->d;
          local_270 = (float *)CONCAT44(local_270._4_4_,iVar30);
          local_278 = top_blob->elemsize;
          local_280 = top_blob->cstep * local_278;
          lVar44 = (long)iVar31 * (long)iVar48;
          iVar45 = 0;
          if (0 < iVar31) {
            iVar45 = iVar31;
          }
          local_288 = top_blob->data;
          uVar26 = top_blob->c;
          if (top_blob->c < 1) {
            uVar26 = 0;
          }
          lVar51 = (long)((local_2d8.w - iVar48) * 2);
          iVar31 = top_blob->dims;
          local_170 = local_d8._M_impl.super__Vector_impl_data._M_start;
          pvVar50 = local_288;
          for (uVar53 = 0; uVar53 != uVar26; uVar53 = uVar53 + 1) {
            iVar34 = (int)((local_278 * lVar44 + 0xf & 0xfffffffffffffff0) / local_278);
            if (iVar31 == 4) {
              iVar34 = (int)lVar44;
            }
            if (lVar40 == 0) {
              uVar90 = 0;
            }
            else {
              uVar90 = *(undefined4 *)(lVar40 + uVar53 * 4);
            }
            fVar87 = local_d8._M_impl.super__Vector_impl_data._M_start[uVar53];
            iVar34 = iVar34 * iVar30;
            if (iVar34 < 1) {
              iVar34 = 0;
            }
            for (lVar22 = 0; iVar34 != (int)lVar22; lVar22 = lVar22 + 1) {
              *(undefined4 *)((long)pvVar50 + lVar22 * 4) = uVar90;
            }
            pvVar37 = (void *)(local_2d8.elemsize * local_2d8.cstep * uVar53 + (long)local_2d8.data)
            ;
            lVar22 = (long)pvVar37 + (long)local_2d8.w;
            pvVar28 = (void *)((long)pvVar37 + (long)local_2d8.w * 2);
            pvVar47 = (void *)(local_280 * uVar53 + (long)local_288);
            for (iVar34 = 0; iVar34 != iVar45; iVar34 = iVar34 + 1) {
              lVar46 = 0;
              pvVar25 = pvVar47;
              for (uVar36 = (long)iVar48; 0 < (int)uVar36; uVar36 = (ulong)((int)uVar36 - 1)) {
                auVar56 = vpinsrb_avx(ZEXT216(*(ushort *)((long)pvVar37 + lVar46)),
                                      (uint)*(byte *)((long)pvVar37 + lVar46 + 2),2);
                auVar56 = vpinsrb_avx(auVar56,(uint)*(byte *)(lVar22 + lVar46),3);
                auVar56 = vpinsrb_avx(auVar56,(uint)*(byte *)(lVar22 + 1 + lVar46),4);
                auVar56 = vpinsrb_avx(auVar56,(uint)*(byte *)(lVar22 + 2 + lVar46),5);
                auVar56 = vpinsrb_avx(auVar56,(uint)*(byte *)((long)pvVar28 + lVar46),6);
                auVar57 = vpinsrb_avx(auVar56,(uint)*(byte *)((long)pvVar28 + lVar46 + 1),7);
                auVar56._8_8_ = 0;
                auVar56._0_8_ = *(ulong *)((long)pvVar4 + uVar53 * 9);
                auVar56 = vpmovsxbw_avx(auVar56);
                auVar57 = vpmovsxbw_avx(auVar57);
                auVar56 = vpmaddwd_avx(auVar56,auVar57);
                auVar56 = vphaddd_avx((undefined1  [16])0x0,auVar56);
                auVar56 = vphaddd_avx(auVar56,auVar56);
                auVar56 = vphaddd_avx(auVar56,auVar56);
                auVar57._0_4_ =
                     (float)(auVar56._0_4_ +
                            (int)*(char *)((long)pvVar4 + uVar53 * 9 + 8) *
                            (int)*(char *)((long)pvVar28 + lVar46 + 2));
                auVar57._4_12_ = auVar116;
                auVar56 = vfmadd213ss_fma(auVar57,ZEXT416((uint)fVar87),
                                          ZEXT416(*(uint *)((long)pvVar47 + lVar46 * 2)));
                *(int *)((long)pvVar47 + lVar46 * 2) = auVar56._0_4_;
                pvVar25 = (void *)((long)pvVar25 + 4);
                lVar46 = lVar46 + 2;
              }
              pvVar37 = (void *)((long)pvVar37 + lVar46 + lVar51);
              lVar22 = lVar22 + lVar51 + lVar46;
              pvVar28 = (void *)((long)pvVar28 + lVar46 + lVar51);
              pvVar47 = pvVar25;
            }
            pvVar50 = (void *)((long)pvVar50 + local_280);
          }
          p_Var39 = &local_d8;
          goto LAB_003e0c0a;
        }
      }
      uVar26 = iVar31 * *(int *)(&this->field_0xd4 + (long)p_Var20);
      local_288 = (void *)(long)(int)uVar26;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,(size_type)local_288,
                 (allocator_type *)&top_rescale);
      pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
      p_Var20 = pp_Var19[-3];
      iVar31 = *(int *)(&this->field_0xe0 + (long)p_Var20);
      uVar16 = opt_q._0_8_;
      iVar45 = *(int *)(&this->field_0xdc + (long)p_Var20);
      iVar34 = *(int *)(&this->field_0xd4 + (long)p_Var20);
      lVar40 = 0;
      iVar32 = 0;
      for (iVar33 = 0; iVar33 < *(int *)(&this->field_0xd8 + (long)p_Var20); iVar33 = iVar33 + 1) {
        for (lVar44 = 0; (int)lVar44 < *(int *)(&this->field_0xd4 + (long)p_Var20);
            lVar44 = lVar44 + 1) {
          *(int *)(opt_q._0_8_ + (long)(int)lVar40 * 4 + lVar44 * 4) = iVar32;
          p_Var20 = pp_Var19[-3];
          iVar32 = iVar32 + *(int *)(&this->field_0xdc + (long)p_Var20);
        }
        iVar32 = iVar32 + (iVar15 * iVar31 - iVar45 * iVar34);
        lVar40 = (int)lVar40 + lVar44;
      }
      local_2f8 = 0;
      if ((int)uVar26 < 1) {
        uVar26 = 0;
      }
      auVar89 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
      for (lVar40 = 0; pvVar4 = local_2d8.data,
          lVar40 < *(int *)(&this->field_0x108 + (long)p_Var20); lVar40 = lVar40 + 1) {
        pfVar43 = (float *)(top_blob->elemsize * lVar40 * top_blob->cstep + (long)top_blob->data);
        lVar51 = local_2d8.cstep * lVar40 * local_2d8.elemsize;
        lVar44 = (long)local_2d8.w * local_2d8.elemsize;
        pvVar50 = (this->weight_data_tm).data;
        local_320 = pfVar43;
        local_280 = lVar40;
        for (iVar31 = 0; iVar31 <= iVar48; iVar31 = iVar31 + 1) {
          pp_Var5 = this->_vptr_ConvolutionDepthWise_x86_avx512;
          for (iVar45 = 0; iVar45 <= iVar30; iVar45 = iVar45 + 1) {
            p_Var20 = pp_Var5[-3];
            iVar34 = 0;
            for (uVar53 = 0; uVar26 != uVar53; uVar53 = uVar53 + 1) {
              iVar34 = iVar34 + (int)*(char *)((long)pvVar50 + uVar53 + local_2f8) *
                                (int)*(char *)((long)pvVar4 +
                                              (long)*(int *)(uVar16 + uVar53 * 4) +
                                              (long)iVar31 *
                                              (long)*(int *)(&this->field_0xe8 + (long)p_Var20) *
                                              lVar44 + (long)iVar45 *
                                                       (long)*(int *)(&this->field_0xe4 +
                                                                     (long)p_Var20) + lVar51);
            }
            fVar87 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var20) + lVar40 * 4);
            fVar86 = 0.0;
            if (fVar87 != 0.0) {
              fVar86 = 1.0 / (fVar87 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var20) +
                                                 lVar40 * 4));
            }
            fVar86 = fVar86 * (float)iVar34;
            if (*(int *)(&this->field_0x100 + (long)p_Var20) != 0) {
              fVar86 = fVar86 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var20) +
                                          lVar40 * 4);
            }
            auVar56 = ZEXT416((uint)fVar86);
            fVar87 = fVar86;
            switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var20)) {
            case 1:
              auVar56 = vmaxss_avx(auVar56,ZEXT416(0));
              fVar87 = auVar56._0_4_;
              break;
            case 2:
              uVar10 = vcmpss_avx512f(auVar56,ZEXT416(0),0xe);
              bVar55 = (bool)((byte)uVar10 & 1);
              fVar87 = (float)((uint)bVar55 * 0x3f800000 +
                              (uint)!bVar55 * **(int **)(&this->field_0x118 + (long)p_Var20)) *
                       fVar86;
              break;
            case 3:
              fVar86 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var20))[1];
              auVar56 = vmaxss_avx(auVar56,ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var20)))
              ;
              fVar87 = auVar56._0_4_;
              if (fVar86 < auVar56._0_4_) {
                fVar87 = fVar86;
              }
              break;
            case 4:
              auVar56 = vminss_avx(auVar56,SUB6416(ZEXT464(0x42b0c0a5),0));
              uVar10 = vcmpss_avx512f(auVar56,ZEXT416(0xc2b0c0a5),1);
              bVar55 = (bool)((byte)uVar10 & 1);
              fVar87 = expf((float)((uint)bVar55 * 0x42b0c0a5 +
                                   (uint)!bVar55 * (auVar56._0_4_ ^ auVar89._0_4_)));
              auVar89 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              lVar40 = local_280;
              fVar87 = 1.0 / (fVar87 + 1.0);
              break;
            case 5:
              local_278 = CONCAT44(local_278._4_4_,fVar86);
              local_270 = pfVar43;
              fVar87 = expf(fVar86);
              fVar87 = logf(fVar87 + 1.0);
              fVar87 = tanhf(fVar87);
              auVar89 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              pfVar43 = local_270;
              fVar87 = fVar87 * (float)local_278;
              break;
            case 6:
              fVar8 = **(float **)(&this->field_0x118 + (long)p_Var20);
              fVar1 = (*(float **)(&this->field_0x118 + (long)p_Var20))[1];
              fVar93 = (float)((uint)fVar1 ^ auVar89._0_4_) / fVar8;
              fVar87 = 0.0;
              if ((fVar93 <= fVar86) && (fVar87 = fVar86, fVar86 <= fVar93 + 1.0 / fVar8)) {
                auVar56 = vfmadd213ss_fma(ZEXT416((uint)fVar8),auVar56,ZEXT416((uint)fVar1));
                fVar87 = auVar56._0_4_ * fVar86;
              }
            }
            if (iVar2 < 0x65) {
              *local_320 = fVar87;
              local_320 = local_320 + 1;
            }
            else {
              fVar87 = fVar87 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var20) +
                                          lVar40 * 4);
              auVar88._8_4_ = 0x3effffff;
              auVar88._0_8_ = 0x3effffff3effffff;
              auVar88._12_4_ = 0x3effffff;
              auVar56 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)fVar87),auVar89._0_16_,0xf8);
              auVar56 = ZEXT416((uint)(fVar87 + auVar56._0_4_));
              auVar56 = vroundss_avx(auVar56,auVar56,0xb);
              iVar34 = (int)auVar56._0_4_;
              if (iVar34 < -0x7e) {
                iVar34 = -0x7f;
              }
              uVar18 = (undefined1)iVar34;
              if (0x7e < iVar34) {
                uVar18 = 0x7f;
              }
              *(undefined1 *)pfVar43 = uVar18;
              pfVar43 = (float *)((long)pfVar43 + 1);
            }
          }
        }
        p_Var20 = pp_Var19[-3];
        local_2f8 = local_2f8 + (long)local_288;
      }
    }
    else {
      iVar34 = 0;
      if (iVar32 != 8) goto LAB_003e0384;
      uVar53 = (long)*(int *)(&this->field_0xd8 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]) *
               (long)*(int *)(&this->field_0xd4 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&opt_q,uVar53,(allocator_type *)&top_rescale);
      pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
      p_Var20 = pp_Var19[-3];
      iVar31 = *(int *)(&this->field_0xe0 + (long)p_Var20);
      iVar45 = *(int *)(&this->field_0xdc + (long)p_Var20);
      iVar34 = *(int *)(&this->field_0xd4 + (long)p_Var20);
      iVar38 = 0;
      lVar40 = 0;
      for (iVar32 = 0; iVar32 < *(int *)(&this->field_0xd8 + (long)p_Var20); iVar32 = iVar32 + 1) {
        for (lVar44 = 0; (int)lVar44 < *(int *)(&this->field_0xd4 + (long)p_Var20);
            lVar44 = lVar44 + 1) {
          *(int *)(opt_q._0_8_ + (long)(int)lVar40 * 4 + lVar44 * 4) = iVar38;
          p_Var20 = pp_Var19[-3];
          iVar38 = iVar38 + *(int *)(&this->field_0xdc + (long)p_Var20);
        }
        iVar38 = iVar38 + (iVar15 * iVar31 - iVar45 * iVar34);
        lVar40 = (int)lVar40 + lVar44;
      }
      uVar23 = 0;
      uVar36 = uVar53 & 0xffffffff;
      if ((int)uVar53 < 1) {
        uVar36 = uVar23;
      }
      uVar52 = (ulong)(uint)iVar33;
      if (iVar33 < 1) {
        uVar52 = uVar23;
      }
      auVar89 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
      auVar91._8_4_ = 0x3f000000;
      auVar91._0_8_ = 0x3f0000003f000000;
      auVar91._12_4_ = 0x3f000000;
      auVar56 = vpbroadcastw_avx512vl(ZEXT216(0x7f));
      auVar57 = vpbroadcastw_avx512vl(ZEXT216(0xff81));
      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar59 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar137 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
      auVar138._8_4_ = 0x3f000000;
      auVar138._0_8_ = 0x3f0000003f000000;
      auVar138._12_4_ = 0x3f000000;
      auVar139._8_4_ = 0x3f800000;
      auVar139._0_8_ = 0x3f8000003f800000;
      auVar139._12_4_ = 0x3f800000;
      auVar140._8_4_ = 0x3f318000;
      auVar140._0_8_ = 0x3f3180003f318000;
      auVar140._12_4_ = 0x3f318000;
      auVar141._8_4_ = 0xb95e8083;
      auVar141._0_8_ = 0xb95e8083b95e8083;
      auVar141._12_4_ = 0xb95e8083;
      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar149 = ZEXT1664(auVar60);
      auVar143 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
      auVar144 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
      auVar145 = ZEXT1664(CONCAT412(0x3d2aa9c1,CONCAT48(0x3d2aa9c1,0x3d2aa9c13d2aa9c1)));
      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar146 = ZEXT1664(auVar60);
      auVar60 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      auVar147 = ZEXT1664(auVar60);
      uVar35 = 0;
      auVar60 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      for (; uVar35 != uVar52; uVar35 = uVar35 + 1) {
        pauVar41 = (undefined1 (*) [16])
                   (top_blob->elemsize * uVar35 * top_blob->cstep + (long)top_blob->data);
        pvVar4 = (this->weight_data_tm).data;
        pauVar42 = pauVar41;
        for (iVar31 = 0; iVar31 <= iVar48; iVar31 = iVar31 + 1) {
          pp_Var19 = this->_vptr_ConvolutionDepthWise_x86_avx512;
          for (iVar45 = 0; iVar45 <= iVar30; iVar45 = iVar45 + 1) {
            p_Var20 = pp_Var19[-3];
            auVar100 = ZEXT1664((undefined1  [16])0x0);
            uVar49 = 0;
            auVar115 = ZEXT1664((undefined1  [16])0x0);
            while( true ) {
              if (uVar36 == uVar49) break;
              auVar117._8_8_ = 0;
              auVar117._0_8_ =
                   *(ulong *)((long)local_2d8.data +
                             (long)*(int *)(opt_q._0_8_ + uVar49 * 4) * 8 +
                             (long)iVar31 * (long)*(int *)(&this->field_0xe8 + (long)p_Var20) *
                             (long)local_2d8.w * local_2d8.elemsize +
                             (long)(*(int *)(&this->field_0xe4 + (long)p_Var20) * iVar45 * 8) +
                             local_2d8.cstep * uVar35 * local_2d8.elemsize);
              auVar67 = vpcmpgtb_avx((undefined1  [16])0x0,auVar117);
              auVar62 = vpunpcklbw_avx(auVar117,auVar67);
              auVar130._8_8_ = 0;
              auVar130._0_8_ = *(ulong *)((long)pvVar4 + uVar49 * 8 + (long)(int)uVar23);
              auVar67 = vpcmpgtb_avx((undefined1  [16])0x0,auVar130);
              auVar67 = vpunpcklbw_avx(auVar130,auVar67);
              auVar66 = vpmullw_avx(auVar67,auVar62);
              auVar67 = vpmulhw_avx(auVar62,auVar67);
              auVar62 = vpunpcklwd_avx(auVar66,auVar67);
              auVar66 = vpunpckhwd_avx(auVar66,auVar67);
              auVar67 = vpaddd_avx(auVar115._0_16_,auVar62);
              auVar115 = ZEXT1664(auVar67);
              auVar67 = vpaddd_avx(auVar100._0_16_,auVar66);
              auVar100 = ZEXT1664(auVar67);
              uVar49 = uVar49 + 1;
            }
            auVar67 = *(undefined1 (*) [16])
                       (*(long *)(&this->field_0x1f8 + (long)p_Var20) + uVar35 * 0x20);
            auVar66 = *(undefined1 (*) [16])
                       (*(long *)(&this->field_0x1f8 + (long)p_Var20) + 0x10 + uVar35 * 0x20);
            auVar62 = vmulps_avx512vl(auVar67,*(undefined1 (*) [16])
                                               (*(long *)(&this->field_0x240 + (long)p_Var20) +
                                               uVar35 * 0x20));
            auVar63 = vmulps_avx512vl(auVar66,*(undefined1 (*) [16])
                                               (*(long *)(&this->field_0x240 + (long)p_Var20) + 0x10
                                               + uVar35 * 0x20));
            auVar62 = vrcpps_avx(auVar62);
            auVar63 = vrcpps_avx(auVar63);
            uVar49 = vcmpps_avx512vl(auVar67,(undefined1  [16])0x0,4);
            uVar9 = vcmpps_avx512vl(auVar66,(undefined1  [16])0x0,4);
            auVar64._4_4_ = (uint)((byte)(uVar49 >> 1) & 1) * auVar62._4_4_;
            auVar64._0_4_ = (uint)((byte)uVar49 & 1) * auVar62._0_4_;
            auVar64._8_4_ = (uint)((byte)(uVar49 >> 2) & 1) * auVar62._8_4_;
            auVar64._12_4_ = (uint)((byte)(uVar49 >> 3) & 1) * auVar62._12_4_;
            auVar65._4_4_ = (uint)((byte)(uVar9 >> 1) & 1) * auVar63._4_4_;
            auVar65._0_4_ = (uint)((byte)uVar9 & 1) * auVar63._0_4_;
            auVar65._8_4_ = (uint)((byte)(uVar9 >> 2) & 1) * auVar63._8_4_;
            auVar65._12_4_ = (uint)((byte)(uVar9 >> 3) & 1) * auVar63._12_4_;
            auVar67 = vcvtdq2ps_avx(auVar115._0_16_);
            auVar66 = vmulps_avx512vl(auVar64,auVar67);
            auVar67 = vcvtdq2ps_avx(auVar100._0_16_);
            auVar67 = vmulps_avx512vl(auVar65,auVar67);
            if (*(int *)(&this->field_0x100 + (long)p_Var20) != 0) {
              auVar66 = vaddps_avx512vl(auVar66,*(undefined1 (*) [16])
                                                 (*(long *)(&this->field_0x1b0 + (long)p_Var20) +
                                                 uVar35 * 0x20));
              auVar67 = vaddps_avx512vl(auVar67,*(undefined1 (*) [16])
                                                 (*(long *)(&this->field_0x1b0 + (long)p_Var20) +
                                                  0x10 + uVar35 * 0x20));
            }
            auVar62 = auVar66;
            auVar63 = auVar67;
            if (*(int *)(&this->field_0x110 + (long)p_Var20) - 1U < 6) {
              auVar62 = vmaxps_avx512vl(auVar66,(undefined1  [16])0x0);
              auVar63 = vmaxps_avx512vl(auVar67,(undefined1  [16])0x0);
              auVar92 = auVar137._0_16_;
              auVar88 = auVar143._0_16_;
              auVar148 = auVar149._0_16_;
              auVar112 = auVar146._0_16_;
              auVar70 = auVar147._0_16_;
              auVar82 = auVar89._0_16_;
              auVar65 = auVar145._0_16_;
              auVar64 = auVar144._0_16_;
              switch(*(int *)(&this->field_0x110 + (long)p_Var20)) {
              case 2:
                uVar90 = **(undefined4 **)(&this->field_0x118 + (long)p_Var20);
                auVar118._4_4_ = uVar90;
                auVar118._0_4_ = uVar90;
                auVar118._8_4_ = uVar90;
                auVar118._12_4_ = uVar90;
                auVar66 = vminps_avx512vl(auVar66,(undefined1  [16])0x0);
                auVar62 = vfmadd231ps_fma(auVar62,auVar118,auVar66);
                auVar67 = vminps_avx512vl(auVar67,(undefined1  [16])0x0);
                auVar63 = vfmadd231ps_fma(auVar63,auVar118,auVar67);
                break;
              case 3:
                uVar90 = **(undefined4 **)(&this->field_0x118 + (long)p_Var20);
                auVar108._4_4_ = uVar90;
                auVar108._0_4_ = uVar90;
                auVar108._8_4_ = uVar90;
                auVar108._12_4_ = uVar90;
                uVar90 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var20))[1];
                auVar126._4_4_ = uVar90;
                auVar126._0_4_ = uVar90;
                auVar126._8_4_ = uVar90;
                auVar126._12_4_ = uVar90;
                auVar66 = vmaxps_avx512vl(auVar66,auVar108);
                auVar62 = vminps_avx(auVar66,auVar126);
                auVar67 = vmaxps_avx512vl(auVar67,auVar108);
                auVar63 = vminps_avx(auVar67,auVar126);
                break;
              case 4:
                auVar66 = vxorps_avx512vl(auVar66,auVar82);
                auVar66 = vminps_avx512vl(auVar66,auVar58);
                auVar63 = vmaxps_avx512vl(auVar66,auVar59);
                auVar62 = vfmadd213ps_fma(auVar92,auVar63,auVar138);
                auVar127._0_4_ = (int)auVar62._0_4_;
                auVar127._4_4_ = (int)auVar62._4_4_;
                auVar127._8_4_ = (int)auVar62._8_4_;
                auVar127._12_4_ = (int)auVar62._12_4_;
                auVar66 = vcvtdq2ps_avx(auVar127);
                uVar49 = vcmpps_avx512vl(auVar62,auVar66,1);
                auVar62 = vsubps_avx512vl(auVar66,auVar139);
                bVar55 = (bool)((byte)uVar49 & 1);
                auVar84._0_4_ =
                     (float)((uint)bVar55 * auVar62._0_4_ | (uint)!bVar55 * auVar66._0_4_);
                bVar55 = (bool)((byte)(uVar49 >> 1) & 1);
                auVar84._4_4_ =
                     (float)((uint)bVar55 * auVar62._4_4_ | (uint)!bVar55 * auVar66._4_4_);
                bVar55 = (bool)((byte)(uVar49 >> 2) & 1);
                auVar84._8_4_ =
                     (float)((uint)bVar55 * auVar62._8_4_ | (uint)!bVar55 * auVar66._8_4_);
                bVar55 = (bool)((byte)(uVar49 >> 3) & 1);
                auVar84._12_4_ =
                     (float)((uint)bVar55 * auVar62._12_4_ | (uint)!bVar55 * auVar66._12_4_);
                auVar66 = vfmsub231ps_fma(auVar63,auVar84,auVar140);
                auVar62 = vfnmsub231ps_fma(auVar66,auVar84,auVar141);
                auVar109._0_4_ = auVar62._0_4_ * auVar62._0_4_;
                auVar109._4_4_ = auVar62._4_4_ * auVar62._4_4_;
                auVar109._8_4_ = auVar62._8_4_ * auVar62._8_4_;
                auVar109._12_4_ = auVar62._12_4_ * auVar62._12_4_;
                auVar66 = vfmadd213ps_avx512vl(auVar88,auVar62,auVar148);
                auVar66 = vfmadd213ps_fma(auVar66,auVar62,auVar64);
                auVar66 = vfmadd213ps_fma(auVar66,auVar62,auVar65);
                auVar66 = vfmadd213ps_avx512vl(auVar66,auVar62,auVar112);
                auVar66 = vfmadd213ps_fma(auVar66,auVar62,auVar138);
                auVar66 = vfmadd213ps_fma(auVar66,auVar109,auVar62);
                auVar110._0_4_ = auVar66._0_4_ + 1.0;
                auVar110._4_4_ = auVar66._4_4_ + 1.0;
                auVar110._8_4_ = auVar66._8_4_ + 1.0;
                auVar110._12_4_ = auVar66._12_4_ + 1.0;
                auVar97._0_4_ = (int)auVar84._0_4_;
                auVar97._4_4_ = (int)auVar84._4_4_;
                auVar97._8_4_ = (int)auVar84._8_4_;
                auVar97._12_4_ = (int)auVar84._12_4_;
                auVar66 = vpslld_avx(auVar97,0x17);
                auVar66 = vpaddd_avx512vl(auVar66,auVar70);
                auVar62 = vfmadd213ps_fma(auVar66,auVar110,auVar139);
                auVar66 = vrcpps_avx(auVar62);
                auVar62 = vfmsub213ps_fma(auVar62,auVar66,auVar139);
                auVar62 = vfnmadd132ps_fma(auVar62,auVar66,auVar66);
                auVar67 = vxorps_avx512vl(auVar67,auVar82);
                auVar67 = vminps_avx512vl(auVar67,auVar58);
                auVar63 = vmaxps_avx512vl(auVar67,auVar59);
                auVar66 = vfmadd213ps_fma(auVar92,auVar63,auVar138);
                auVar136._0_4_ = (int)auVar66._0_4_;
                auVar136._4_4_ = (int)auVar66._4_4_;
                auVar136._8_4_ = (int)auVar66._8_4_;
                auVar136._12_4_ = (int)auVar66._12_4_;
                auVar67 = vcvtdq2ps_avx(auVar136);
                uVar49 = vcmpps_avx512vl(auVar66,auVar67,1);
                auVar66 = vsubps_avx512vl(auVar67,auVar139);
                bVar55 = (bool)((byte)uVar49 & 1);
                auVar85._0_4_ =
                     (float)((uint)bVar55 * auVar66._0_4_ | (uint)!bVar55 * auVar67._0_4_);
                bVar55 = (bool)((byte)(uVar49 >> 1) & 1);
                auVar85._4_4_ =
                     (float)((uint)bVar55 * auVar66._4_4_ | (uint)!bVar55 * auVar67._4_4_);
                bVar55 = (bool)((byte)(uVar49 >> 2) & 1);
                auVar85._8_4_ =
                     (float)((uint)bVar55 * auVar66._8_4_ | (uint)!bVar55 * auVar67._8_4_);
                bVar55 = (bool)((byte)(uVar49 >> 3) & 1);
                auVar85._12_4_ =
                     (float)((uint)bVar55 * auVar66._12_4_ | (uint)!bVar55 * auVar67._12_4_);
                auVar67 = vfmsub231ps_fma(auVar63,auVar85,auVar140);
                auVar66 = vfnmsub231ps_fma(auVar67,auVar85,auVar141);
                auVar128._0_4_ = auVar66._0_4_ * auVar66._0_4_;
                auVar128._4_4_ = auVar66._4_4_ * auVar66._4_4_;
                auVar128._8_4_ = auVar66._8_4_ * auVar66._8_4_;
                auVar128._12_4_ = auVar66._12_4_ * auVar66._12_4_;
                auVar67 = vfmadd213ps_avx512vl(auVar88,auVar66,auVar148);
                auVar67 = vfmadd213ps_fma(auVar67,auVar66,auVar64);
                auVar67 = vfmadd213ps_fma(auVar67,auVar66,auVar65);
                auVar67 = vfmadd213ps_avx512vl(auVar67,auVar66,auVar112);
                auVar67 = vfmadd213ps_fma(auVar67,auVar66,auVar138);
                auVar67 = vfmadd213ps_fma(auVar67,auVar128,auVar66);
                auVar129._0_4_ = auVar67._0_4_ + 1.0;
                auVar129._4_4_ = auVar67._4_4_ + 1.0;
                auVar129._8_4_ = auVar67._8_4_ + 1.0;
                auVar129._12_4_ = auVar67._12_4_ + 1.0;
                auVar111._0_4_ = (int)auVar85._0_4_;
                auVar111._4_4_ = (int)auVar85._4_4_;
                auVar111._8_4_ = (int)auVar85._8_4_;
                auVar111._12_4_ = (int)auVar85._12_4_;
                auVar67 = vpslld_avx(auVar111,0x17);
                auVar67 = vpaddd_avx512vl(auVar67,auVar70);
                auVar66 = vfmadd213ps_fma(auVar67,auVar129,auVar139);
                auVar67 = vrcpps_avx(auVar66);
                auVar66 = vfmsub213ps_fma(auVar66,auVar67,auVar139);
                auVar63 = vfnmadd132ps_fma(auVar66,auVar67,auVar67);
                break;
              case 5:
                auVar62 = vminps_avx512vl(auVar66,auVar58);
                auVar68 = vmaxps_avx512vl(auVar62,auVar59);
                auVar63 = vfmadd213ps_fma(auVar92,auVar68,auVar138);
                auVar119._0_4_ = (int)auVar63._0_4_;
                auVar119._4_4_ = (int)auVar63._4_4_;
                auVar119._8_4_ = (int)auVar63._8_4_;
                auVar119._12_4_ = (int)auVar63._12_4_;
                auVar62 = vcvtdq2ps_avx(auVar119);
                uVar49 = vcmpps_avx512vl(auVar63,auVar62,1);
                auVar63 = vsubps_avx512vl(auVar62,auVar139);
                bVar55 = (bool)((byte)uVar49 & 1);
                auVar75._0_4_ =
                     (float)((uint)bVar55 * auVar63._0_4_ | (uint)!bVar55 * auVar62._0_4_);
                bVar55 = (bool)((byte)(uVar49 >> 1) & 1);
                auVar75._4_4_ =
                     (float)((uint)bVar55 * auVar63._4_4_ | (uint)!bVar55 * auVar62._4_4_);
                bVar55 = (bool)((byte)(uVar49 >> 2) & 1);
                auVar75._8_4_ =
                     (float)((uint)bVar55 * auVar63._8_4_ | (uint)!bVar55 * auVar62._8_4_);
                bVar55 = (bool)((byte)(uVar49 >> 3) & 1);
                auVar75._12_4_ =
                     (float)((uint)bVar55 * auVar63._12_4_ | (uint)!bVar55 * auVar62._12_4_);
                auVar62 = vfmsub231ps_fma(auVar68,auVar75,auVar140);
                auVar63 = vfnmsub231ps_fma(auVar62,auVar75,auVar141);
                auVar101._0_4_ = auVar63._0_4_ * auVar63._0_4_;
                auVar101._4_4_ = auVar63._4_4_ * auVar63._4_4_;
                auVar101._8_4_ = auVar63._8_4_ * auVar63._8_4_;
                auVar101._12_4_ = auVar63._12_4_ * auVar63._12_4_;
                auVar62 = vfmadd213ps_avx512vl(auVar88,auVar63,auVar148);
                auVar62 = vfmadd213ps_fma(auVar62,auVar63,auVar64);
                auVar62 = vfmadd213ps_fma(auVar62,auVar63,auVar65);
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar63,auVar112);
                auVar62 = vfmadd213ps_fma(auVar62,auVar63,auVar138);
                auVar62 = vfmadd213ps_fma(auVar62,auVar101,auVar63);
                auVar94._0_4_ = auVar62._0_4_ + 1.0;
                auVar94._4_4_ = auVar62._4_4_ + 1.0;
                auVar94._8_4_ = auVar62._8_4_ + 1.0;
                auVar94._12_4_ = auVar62._12_4_ + 1.0;
                auVar102._0_4_ = (int)auVar75._0_4_;
                auVar102._4_4_ = (int)auVar75._4_4_;
                auVar102._8_4_ = (int)auVar75._8_4_;
                auVar102._12_4_ = (int)auVar75._12_4_;
                auVar62 = vpslld_avx(auVar102,0x17);
                auVar62 = vpaddd_avx512vl(auVar62,auVar70);
                auVar62 = vfmadd213ps_fma(auVar62,auVar94,auVar139);
                uVar49 = vcmpps_avx512vl(auVar62,(undefined1  [16])0x0,2);
                auVar63 = vbroadcastss_avx512vl(ZEXT416(0x800000));
                auVar62 = vmaxps_avx512vl(auVar62,auVar63);
                auVar68 = vpsrld_avx(auVar62,0x17);
                auVar63 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                auVar63 = vpternlogd_avx512vl(auVar62,auVar91,auVar63,0xec);
                auVar69 = vmovdqa64_avx512vl(auVar70);
                auVar62 = vpbroadcastd_avx512vl(ZEXT416(0xffffff82));
                auVar62 = vpaddd_avx512vl(auVar68,auVar62);
                auVar62 = vcvtdq2ps_avx(auVar62);
                auVar70 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
                uVar9 = vcmpps_avx512vl(auVar63,auVar70,1);
                auVar70 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
                auVar70 = vaddps_avx512vl(auVar63,auVar70);
                auVar68 = vsubps_avx512vl(auVar62,auVar139);
                bVar55 = (bool)((byte)uVar9 & 1);
                auVar71._0_4_ = (uint)bVar55 * auVar68._0_4_ | (uint)!bVar55 * auVar62._0_4_;
                bVar55 = (bool)((byte)(uVar9 >> 1) & 1);
                auVar71._4_4_ = (uint)bVar55 * auVar68._4_4_ | (uint)!bVar55 * auVar62._4_4_;
                bVar55 = (bool)((byte)(uVar9 >> 2) & 1);
                auVar71._8_4_ = (uint)bVar55 * auVar68._8_4_ | (uint)!bVar55 * auVar62._8_4_;
                bVar55 = (bool)((byte)(uVar9 >> 3) & 1);
                auVar71._12_4_ = (uint)bVar55 * auVar68._12_4_ | (uint)!bVar55 * auVar62._12_4_;
                auVar62 = vaddps_avx512vl(auVar70,auVar63);
                bVar55 = (bool)((byte)uVar9 & 1);
                auVar72._0_4_ =
                     (float)((uint)bVar55 * auVar62._0_4_ | (uint)!bVar55 * auVar70._0_4_);
                bVar55 = (bool)((byte)(uVar9 >> 1) & 1);
                auVar72._4_4_ =
                     (float)((uint)bVar55 * auVar62._4_4_ | (uint)!bVar55 * auVar70._4_4_);
                bVar55 = (bool)((byte)(uVar9 >> 2) & 1);
                auVar72._8_4_ =
                     (float)((uint)bVar55 * auVar62._8_4_ | (uint)!bVar55 * auVar70._8_4_);
                bVar55 = (bool)((byte)(uVar9 >> 3) & 1);
                auVar72._12_4_ =
                     (float)((uint)bVar55 * auVar62._12_4_ | (uint)!bVar55 * auVar70._12_4_);
                auVar95._0_4_ = auVar72._0_4_ * auVar72._0_4_;
                auVar95._4_4_ = auVar72._4_4_ * auVar72._4_4_;
                auVar95._8_4_ = auVar72._8_4_ * auVar72._8_4_;
                auVar95._12_4_ = auVar72._12_4_ * auVar72._12_4_;
                auVar62 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
                auVar62 = vfmadd213ps_avx512vl(auVar60,auVar72,auVar62);
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar72,auVar61);
                auVar73 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar72,auVar73);
                auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar72,auVar74);
                auVar75 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar72,auVar75);
                auVar76 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar72,auVar76);
                auVar77 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar72,auVar77);
                auVar142._8_4_ = 0x3eaaaaaa;
                auVar142._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar142._12_4_ = 0x3eaaaaaa;
                auVar62 = vfmadd213ps_fma(auVar62,auVar72,auVar142);
                auVar131._0_4_ = auVar95._0_4_ * auVar72._0_4_ * auVar62._0_4_;
                auVar131._4_4_ = auVar95._4_4_ * auVar72._4_4_ * auVar62._4_4_;
                auVar131._8_4_ = auVar95._8_4_ * auVar72._8_4_ * auVar62._8_4_;
                auVar131._12_4_ = auVar95._12_4_ * auVar72._12_4_ * auVar62._12_4_;
                auVar62 = vfmadd231ps_fma(auVar131,auVar71,auVar141);
                auVar62 = vfmsub231ps_fma(auVar62,auVar138,auVar95);
                auVar62 = vsubps_avx(auVar62,auVar72);
                auVar62 = vfmsub231ps_fma(auVar62,auVar140,auVar71);
                bVar55 = (bool)((byte)uVar49 & 1);
                auVar78._0_4_ =
                     (uint)bVar55 * 0x7fffffff | (uint)!bVar55 * (int)(auVar62._0_4_ * -2.0);
                bVar55 = (bool)((byte)(uVar49 >> 1) & 1);
                auVar78._4_4_ =
                     (uint)bVar55 * 0x7fffffff | (uint)!bVar55 * (int)(auVar62._4_4_ * -2.0);
                bVar55 = (bool)((byte)(uVar49 >> 2) & 1);
                auVar78._8_4_ =
                     (uint)bVar55 * 0x7fffffff | (uint)!bVar55 * (int)(auVar62._8_4_ * -2.0);
                bVar55 = (bool)((byte)(uVar49 >> 3) & 1);
                auVar78._12_4_ =
                     (uint)bVar55 * 0x7fffffff | (uint)!bVar55 * (int)(auVar62._12_4_ * -2.0);
                auVar62 = vminps_avx512vl(auVar78,auVar58);
                auVar70 = vmaxps_avx512vl(auVar62,auVar59);
                auVar63 = vfmadd213ps_fma(auVar92,auVar70,auVar138);
                auVar120._0_4_ = (int)auVar63._0_4_;
                auVar120._4_4_ = (int)auVar63._4_4_;
                auVar120._8_4_ = (int)auVar63._8_4_;
                auVar120._12_4_ = (int)auVar63._12_4_;
                auVar62 = vcvtdq2ps_avx(auVar120);
                uVar49 = vcmpps_avx512vl(auVar63,auVar62,1);
                auVar63 = vsubps_avx512vl(auVar62,auVar139);
                bVar55 = (bool)((byte)uVar49 & 1);
                auVar79._0_4_ =
                     (float)((uint)bVar55 * auVar63._0_4_ | (uint)!bVar55 * auVar62._0_4_);
                bVar55 = (bool)((byte)(uVar49 >> 1) & 1);
                auVar79._4_4_ =
                     (float)((uint)bVar55 * auVar63._4_4_ | (uint)!bVar55 * auVar62._4_4_);
                bVar55 = (bool)((byte)(uVar49 >> 2) & 1);
                auVar79._8_4_ =
                     (float)((uint)bVar55 * auVar63._8_4_ | (uint)!bVar55 * auVar62._8_4_);
                bVar55 = (bool)((byte)(uVar49 >> 3) & 1);
                auVar79._12_4_ =
                     (float)((uint)bVar55 * auVar63._12_4_ | (uint)!bVar55 * auVar62._12_4_);
                auVar62 = vfmsub231ps_fma(auVar70,auVar79,auVar140);
                auVar63 = vfnmsub231ps_fma(auVar62,auVar79,auVar141);
                auVar103._0_4_ = auVar63._0_4_ * auVar63._0_4_;
                auVar103._4_4_ = auVar63._4_4_ * auVar63._4_4_;
                auVar103._8_4_ = auVar63._8_4_ * auVar63._8_4_;
                auVar103._12_4_ = auVar63._12_4_ * auVar63._12_4_;
                auVar62 = vfmadd213ps_fma(auVar88,auVar63,auVar148);
                auVar62 = vfmadd213ps_fma(auVar62,auVar63,auVar64);
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar63,auVar65);
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar63,auVar112);
                auVar62 = vfmadd213ps_fma(auVar62,auVar63,auVar138);
                auVar62 = vfmadd213ps_fma(auVar62,auVar103,auVar63);
                auVar104._0_4_ = auVar62._0_4_ + 1.0;
                auVar104._4_4_ = auVar62._4_4_ + 1.0;
                auVar104._8_4_ = auVar62._8_4_ + 1.0;
                auVar104._12_4_ = auVar62._12_4_ + 1.0;
                auVar96._0_4_ = (int)auVar79._0_4_;
                auVar96._4_4_ = (int)auVar79._4_4_;
                auVar96._8_4_ = (int)auVar79._8_4_;
                auVar96._12_4_ = (int)auVar79._12_4_;
                auVar62 = vpslld_avx(auVar96,0x17);
                auVar62 = vpaddd_avx(auVar69,auVar62);
                auVar63 = vfmadd213ps_fma(auVar62,auVar104,auVar139);
                auVar62 = vrcpps_avx(auVar63);
                auVar121._0_4_ = auVar62._0_4_ + auVar62._0_4_;
                auVar121._4_4_ = auVar62._4_4_ + auVar62._4_4_;
                auVar121._8_4_ = auVar62._8_4_ + auVar62._8_4_;
                auVar121._12_4_ = auVar62._12_4_ + auVar62._12_4_;
                auVar132._8_4_ = 0x40000000;
                auVar132._0_8_ = 0x4000000040000000;
                auVar132._12_4_ = 0x40000000;
                auVar63 = vfmsub213ps_fma(auVar63,auVar121,auVar132);
                auVar70 = vfnmadd213ps_fma(auVar63,auVar62,auVar121);
                auVar62 = vminps_avx512vl(auVar67,auVar58);
                auVar68 = vmaxps_avx512vl(auVar62,auVar59);
                auVar63 = vfmadd213ps_fma(auVar92,auVar68,auVar138);
                auVar133._0_4_ = (int)auVar63._0_4_;
                auVar133._4_4_ = (int)auVar63._4_4_;
                auVar133._8_4_ = (int)auVar63._8_4_;
                auVar133._12_4_ = (int)auVar63._12_4_;
                auVar62 = vcvtdq2ps_avx(auVar133);
                uVar49 = vcmpps_avx512vl(auVar63,auVar62,1);
                auVar63 = vsubps_avx512vl(auVar62,auVar139);
                bVar55 = (bool)((byte)uVar49 & 1);
                auVar80._0_4_ =
                     (float)((uint)bVar55 * auVar63._0_4_ | (uint)!bVar55 * auVar62._0_4_);
                bVar55 = (bool)((byte)(uVar49 >> 1) & 1);
                auVar80._4_4_ =
                     (float)((uint)bVar55 * auVar63._4_4_ | (uint)!bVar55 * auVar62._4_4_);
                bVar55 = (bool)((byte)(uVar49 >> 2) & 1);
                auVar80._8_4_ =
                     (float)((uint)bVar55 * auVar63._8_4_ | (uint)!bVar55 * auVar62._8_4_);
                bVar55 = (bool)((byte)(uVar49 >> 3) & 1);
                auVar80._12_4_ =
                     (float)((uint)bVar55 * auVar63._12_4_ | (uint)!bVar55 * auVar62._12_4_);
                auVar62 = vfmsub231ps_fma(auVar68,auVar80,auVar140);
                auVar63 = vfnmsub231ps_fma(auVar62,auVar80,auVar141);
                auVar122._0_4_ = auVar63._0_4_ * auVar63._0_4_;
                auVar122._4_4_ = auVar63._4_4_ * auVar63._4_4_;
                auVar122._8_4_ = auVar63._8_4_ * auVar63._8_4_;
                auVar122._12_4_ = auVar63._12_4_ * auVar63._12_4_;
                auVar62 = vfmadd213ps_fma(auVar88,auVar63,auVar148);
                auVar62 = vfmadd213ps_fma(auVar62,auVar63,auVar64);
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar63,auVar65);
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar63,auVar112);
                auVar62 = vfmadd213ps_fma(auVar62,auVar63,auVar138);
                auVar62 = vfmadd213ps_fma(auVar62,auVar122,auVar63);
                auVar105._0_4_ = auVar62._0_4_ + 1.0;
                auVar105._4_4_ = auVar62._4_4_ + 1.0;
                auVar105._8_4_ = auVar62._8_4_ + 1.0;
                auVar105._12_4_ = auVar62._12_4_ + 1.0;
                auVar123._0_4_ = (int)auVar80._0_4_;
                auVar123._4_4_ = (int)auVar80._4_4_;
                auVar123._8_4_ = (int)auVar80._8_4_;
                auVar123._12_4_ = (int)auVar80._12_4_;
                auVar62 = vpslld_avx(auVar123,0x17);
                auVar62 = vpaddd_avx(auVar69,auVar62);
                auVar62 = vfmadd213ps_fma(auVar62,auVar105,auVar139);
                uVar49 = vcmpps_avx512vl(auVar62,(undefined1  [16])0x0,2);
                auVar68._8_4_ = 0x800000;
                auVar68._0_8_ = 0x80000000800000;
                auVar68._12_4_ = 0x800000;
                auVar62 = vmaxps_avx512vl(auVar62,auVar68);
                auVar68 = vpsrld_avx(auVar62,0x17);
                auVar11._8_4_ = 0x807fffff;
                auVar11._0_8_ = 0x807fffff807fffff;
                auVar11._12_4_ = 0x807fffff;
                auVar62 = vpternlogd_avx512vl(auVar62,auVar91,auVar11,0xec);
                auVar12._8_4_ = 0x3f3504f3;
                auVar12._0_8_ = 0x3f3504f33f3504f3;
                auVar12._12_4_ = 0x3f3504f3;
                uVar9 = vcmpps_avx512vl(auVar62,auVar12,1);
                auVar13._8_4_ = 0xbf800000;
                auVar13._0_8_ = 0xbf800000bf800000;
                auVar13._12_4_ = 0xbf800000;
                auVar63 = vaddps_avx512vl(auVar62,auVar13);
                auVar62 = vaddps_avx512vl(auVar63,auVar62);
                bVar55 = (bool)((byte)uVar9 & 1);
                auVar81._0_4_ =
                     (float)((uint)bVar55 * auVar62._0_4_ | (uint)!bVar55 * auVar63._0_4_);
                bVar55 = (bool)((byte)(uVar9 >> 1) & 1);
                auVar81._4_4_ =
                     (float)((uint)bVar55 * auVar62._4_4_ | (uint)!bVar55 * auVar63._4_4_);
                bVar55 = (bool)((byte)(uVar9 >> 2) & 1);
                auVar81._8_4_ =
                     (float)((uint)bVar55 * auVar62._8_4_ | (uint)!bVar55 * auVar63._8_4_);
                bVar55 = (bool)((byte)(uVar9 >> 3) & 1);
                auVar81._12_4_ =
                     (float)((uint)bVar55 * auVar62._12_4_ | (uint)!bVar55 * auVar63._12_4_);
                auVar106._0_4_ = auVar81._0_4_ * auVar81._0_4_;
                auVar106._4_4_ = auVar81._4_4_ * auVar81._4_4_;
                auVar106._8_4_ = auVar81._8_4_ * auVar81._8_4_;
                auVar106._12_4_ = auVar81._12_4_ * auVar81._12_4_;
                auVar14._8_4_ = 0xbdebd1b8;
                auVar14._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar14._12_4_ = 0xbdebd1b8;
                auVar62 = vfmadd213ps_avx512vl(auVar60,auVar81,auVar14);
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar81,auVar61);
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar81,auVar73);
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar81,auVar74);
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar81,auVar75);
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar81,auVar76);
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar81,auVar77);
                auVar73._8_4_ = 0x3eaaaaaa;
                auVar73._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar73._12_4_ = 0x3eaaaaaa;
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar81,auVar73);
                auVar63 = vmulps_avx512vl(auVar106,auVar81);
                auVar63 = vmulps_avx512vl(auVar63,auVar62);
                auVar74._8_4_ = 0xffffff82;
                auVar74._0_8_ = 0xffffff82ffffff82;
                auVar74._12_4_ = 0xffffff82;
                auVar62 = vpaddd_avx512vl(auVar68,auVar74);
                auVar149 = ZEXT1664(auVar148);
                auVar137 = ZEXT1664(auVar92);
                auVar144 = ZEXT1664(auVar64);
                auVar145 = ZEXT1664(auVar65);
                auVar146 = ZEXT1664(auVar112);
                auVar68 = vmovdqa64_avx512vl(auVar69);
                auVar147 = ZEXT1664(auVar68);
                auVar143 = ZEXT1664(auVar88);
                auVar89 = ZEXT1664(auVar82);
                auVar62 = vcvtdq2ps_avx(auVar62);
                auVar82 = vsubps_avx512vl(auVar62,auVar139);
                bVar55 = (bool)((byte)uVar9 & 1);
                auVar76._0_4_ = (uint)bVar55 * auVar82._0_4_ | (uint)!bVar55 * auVar62._0_4_;
                bVar55 = (bool)((byte)(uVar9 >> 1) & 1);
                auVar76._4_4_ = (uint)bVar55 * auVar82._4_4_ | (uint)!bVar55 * auVar62._4_4_;
                bVar55 = (bool)((byte)(uVar9 >> 2) & 1);
                auVar76._8_4_ = (uint)bVar55 * auVar82._8_4_ | (uint)!bVar55 * auVar62._8_4_;
                bVar55 = (bool)((byte)(uVar9 >> 3) & 1);
                auVar76._12_4_ = (uint)bVar55 * auVar82._12_4_ | (uint)!bVar55 * auVar62._12_4_;
                auVar62 = vfmadd231ps_fma(auVar63,auVar76,auVar141);
                auVar62 = vfmsub231ps_fma(auVar62,auVar138,auVar106);
                auVar62 = vsubps_avx(auVar62,auVar81);
                auVar62 = vfmsub231ps_fma(auVar62,auVar140,auVar76);
                auVar69._8_4_ = 0xc0000000;
                auVar69._0_8_ = 0xc0000000c0000000;
                auVar69._12_4_ = 0xc0000000;
                auVar62 = vmulps_avx512vl(auVar62,auVar69);
                bVar55 = (bool)((byte)uVar49 & 1);
                auVar77._0_4_ = (uint)bVar55 * 0x7fffffff | (uint)!bVar55 * auVar62._0_4_;
                bVar55 = (bool)((byte)(uVar49 >> 1) & 1);
                auVar77._4_4_ = (uint)bVar55 * 0x7fffffff | (uint)!bVar55 * auVar62._4_4_;
                bVar55 = (bool)((byte)(uVar49 >> 2) & 1);
                auVar77._8_4_ = (uint)bVar55 * 0x7fffffff | (uint)!bVar55 * auVar62._8_4_;
                bVar55 = (bool)((byte)(uVar49 >> 3) & 1);
                auVar77._12_4_ = (uint)bVar55 * 0x7fffffff | (uint)!bVar55 * auVar62._12_4_;
                auVar62 = vminps_avx512vl(auVar77,auVar58);
                auVar82 = vmaxps_avx512vl(auVar62,auVar59);
                auVar63 = vfmadd213ps_fma(auVar92,auVar82,auVar138);
                auVar134._0_4_ = (int)auVar63._0_4_;
                auVar134._4_4_ = (int)auVar63._4_4_;
                auVar134._8_4_ = (int)auVar63._8_4_;
                auVar134._12_4_ = (int)auVar63._12_4_;
                auVar62 = vcvtdq2ps_avx(auVar134);
                uVar49 = vcmpps_avx512vl(auVar63,auVar62,1);
                auVar63 = vsubps_avx512vl(auVar62,auVar139);
                bVar55 = (bool)((byte)uVar49 & 1);
                auVar83._0_4_ =
                     (float)((uint)bVar55 * auVar63._0_4_ | (uint)!bVar55 * auVar62._0_4_);
                bVar55 = (bool)((byte)(uVar49 >> 1) & 1);
                auVar83._4_4_ =
                     (float)((uint)bVar55 * auVar63._4_4_ | (uint)!bVar55 * auVar62._4_4_);
                bVar55 = (bool)((byte)(uVar49 >> 2) & 1);
                auVar83._8_4_ =
                     (float)((uint)bVar55 * auVar63._8_4_ | (uint)!bVar55 * auVar62._8_4_);
                bVar55 = (bool)((byte)(uVar49 >> 3) & 1);
                auVar83._12_4_ =
                     (float)((uint)bVar55 * auVar63._12_4_ | (uint)!bVar55 * auVar62._12_4_);
                auVar62 = vfmsub231ps_fma(auVar82,auVar83,auVar140);
                auVar63 = vfnmsub231ps_fma(auVar62,auVar83,auVar141);
                auVar124._0_4_ = auVar63._0_4_ * auVar63._0_4_;
                auVar124._4_4_ = auVar63._4_4_ * auVar63._4_4_;
                auVar124._8_4_ = auVar63._8_4_ * auVar63._8_4_;
                auVar124._12_4_ = auVar63._12_4_ * auVar63._12_4_;
                auVar62 = vfmadd213ps_avx512vl(auVar88,auVar63,auVar148);
                auVar62 = vfmadd213ps_fma(auVar62,auVar63,auVar64);
                auVar62 = vfmadd213ps_fma(auVar62,auVar63,auVar65);
                auVar62 = vfmadd213ps_avx512vl(auVar62,auVar63,auVar112);
                auVar62 = vfmadd213ps_fma(auVar62,auVar63,auVar138);
                auVar62 = vfmadd213ps_fma(auVar62,auVar124,auVar63);
                auVar125._0_4_ = auVar62._0_4_ + 1.0;
                auVar125._4_4_ = auVar62._4_4_ + 1.0;
                auVar125._8_4_ = auVar62._8_4_ + 1.0;
                auVar125._12_4_ = auVar62._12_4_ + 1.0;
                auVar107._0_4_ = (int)auVar83._0_4_;
                auVar107._4_4_ = (int)auVar83._4_4_;
                auVar107._8_4_ = (int)auVar83._8_4_;
                auVar107._12_4_ = (int)auVar83._12_4_;
                auVar62 = vpslld_avx(auVar107,0x17);
                auVar62 = vpaddd_avx512vl(auVar62,auVar68);
                auVar63 = vfmadd213ps_fma(auVar62,auVar125,auVar139);
                auVar62 = vrcpps_avx(auVar63);
                auVar135._0_4_ = auVar62._0_4_ + auVar62._0_4_;
                auVar135._4_4_ = auVar62._4_4_ + auVar62._4_4_;
                auVar135._8_4_ = auVar62._8_4_ + auVar62._8_4_;
                auVar135._12_4_ = auVar62._12_4_ + auVar62._12_4_;
                auVar148._8_4_ = 0x40000000;
                auVar148._0_8_ = 0x4000000040000000;
                auVar148._12_4_ = 0x40000000;
                auVar63 = vfmsub213ps_avx512vl(auVar63,auVar135,auVar148);
                auVar63 = vfnmadd213ps_fma(auVar63,auVar62,auVar135);
                auVar62 = vfmsub213ps_avx512vl(auVar70,auVar66,auVar66);
                auVar63 = vfmsub213ps_avx512vl(auVar63,auVar67,auVar67);
                break;
              case 6:
                uVar90 = **(undefined4 **)(&this->field_0x118 + (long)p_Var20);
                auVar112._4_4_ = uVar90;
                auVar112._0_4_ = uVar90;
                auVar112._8_4_ = uVar90;
                auVar112._12_4_ = uVar90;
                uVar90 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var20))[1];
                auVar70._4_4_ = uVar90;
                auVar70._0_4_ = uVar90;
                auVar70._8_4_ = uVar90;
                auVar70._12_4_ = uVar90;
                auVar62 = vfmadd213ps_fma(auVar66,auVar112,auVar70);
                auVar62 = vmaxps_avx(auVar62,(undefined1  [16])0x0);
                auVar62 = vminps_avx(auVar139,auVar62);
                auVar62 = vmulps_avx512vl(auVar62,auVar66);
                auVar66 = vfmadd213ps_avx512vl(auVar112,auVar67,auVar70);
                auVar66 = vmaxps_avx(auVar66,(undefined1  [16])0x0);
                auVar66 = vminps_avx(auVar139,auVar66);
                auVar63 = vmulps_avx512vl(auVar66,auVar67);
              }
            }
            if (iVar2 < 0x65) {
              *pauVar42 = auVar62;
              pauVar42[1] = auVar63;
              pauVar42 = pauVar42 + 2;
            }
            else {
              pfVar43 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var20) + uVar35 * 0x20);
              auVar98._0_4_ = auVar62._0_4_ * *pfVar43;
              auVar98._4_4_ = auVar62._4_4_ * pfVar43[1];
              auVar98._8_4_ = auVar62._8_4_ * pfVar43[2];
              auVar98._12_4_ = auVar62._12_4_ * pfVar43[3];
              pfVar43 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var20) + 0x10 +
                                 uVar35 * 0x20);
              auVar113._0_4_ = auVar63._0_4_ * *pfVar43;
              auVar113._4_4_ = auVar63._4_4_ * pfVar43[1];
              auVar113._8_4_ = auVar63._8_4_ * pfVar43[2];
              auVar113._12_4_ = auVar63._12_4_ * pfVar43[3];
              auVar67 = vpternlogd_avx512vl(auVar91,auVar98,auVar89._0_16_,0xf8);
              auVar66 = vpternlogd_avx512vl(auVar91,auVar113,auVar89._0_16_,0xf8);
              auVar99._0_4_ = (int)(auVar98._0_4_ + auVar67._0_4_);
              auVar99._4_4_ = (int)(auVar98._4_4_ + auVar67._4_4_);
              auVar99._8_4_ = (int)(auVar98._8_4_ + auVar67._8_4_);
              auVar99._12_4_ = (int)(auVar98._12_4_ + auVar67._12_4_);
              auVar114._0_4_ = (int)(auVar113._0_4_ + auVar66._0_4_);
              auVar114._4_4_ = (int)(auVar113._4_4_ + auVar66._4_4_);
              auVar114._8_4_ = (int)(auVar113._8_4_ + auVar66._8_4_);
              auVar114._12_4_ = (int)(auVar113._12_4_ + auVar66._12_4_);
              auVar67 = vpackssdw_avx(auVar99,auVar114);
              auVar67 = vpminsw_avx512vl(auVar67,auVar56);
              auVar67 = vpmaxsw_avx512vl(auVar67,auVar57);
              auVar67 = vpacksswb_avx(auVar67,auVar67);
              *(long *)*pauVar41 = auVar67._0_8_;
              pauVar41 = (undefined1 (*) [16])((long)*pauVar41 + 8);
            }
          }
        }
        uVar23 = (ulong)(uint)((int)uVar23 + (int)uVar53 * 8);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
    iVar34 = 0;
    goto LAB_003e0384;
  }
  uVar27 = *(uint *)(&this->field_0xd0 + (long)p_Var20);
  iVar48 = *(int *)(&this->field_0x10c + (long)p_Var20);
  if (opt->use_packing_layout == true) {
    if (iVar48 < 0x65) {
      uVar53 = (ulong)((uint)((uVar27 & 3) == 0) * 3 + 1);
    }
    else {
      uVar53 = 1;
      if ((uVar27 & 7) == 0) {
        uVar53 = 8;
      }
    }
  }
  else {
    uVar53 = 1;
  }
  _elempack = (uint)uVar53;
  uVar36 = (ulong)(_elempack * 4);
  if (100 < iVar48) {
    uVar36 = uVar53;
  }
  Mat::create(top_blob,iVar31,iVar45,(int)uVar27 / (int)_elempack,uVar36,_elempack,
              opt->blob_allocator);
  OVar17 = opt_q;
  sVar7 = local_2d8.cstep;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_003e0384;
  uVar23 = (long)(int)uVar26 /
           (long)*(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]
                         );
  uVar52 = (long)*(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3])
           / (long)*(int *)(&this->field_0x108 +
                           (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]);
  if (opt->use_packing_layout == true) {
    uVar26 = 1;
    if ((uVar23 & 7) == 0) {
      uVar26 = 8;
    }
    if (iVar48 < 0x65) {
      uVar27 = (uint)((uVar52 & 3) == 0) * 3 + 1;
    }
    else {
      uVar27 = 1;
      if ((uVar52 & 7) == 0) {
        uVar27 = 8;
      }
    }
  }
  else {
    uVar26 = 1;
    uVar27 = uVar26;
  }
  piVar3 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
  opt_q.blob_allocator._4_4_ = local_2d8.refcount._4_4_;
  opt_q.blob_allocator._0_4_ = local_2d8.refcount._0_4_;
  opt_q._0_8_ = local_2d8.data;
  opt_q.workspace_allocator = (Allocator *)local_2d8.elemsize;
  opt_q._28_36_ = OVar17._28_36_;
  opt_q.openmp_blocktime = local_2d8.elempack;
  opt_q._32_8_ = local_2d8.allocator;
  opt_q.use_subgroup_shuffle = (bool)(undefined1)local_2d8.w;
  opt_q.use_image_storage = (bool)local_2d8.w._1_1_;
  opt_q.use_tensor_storage = (bool)local_2d8.w._2_1_;
  opt_q.use_reserved_0 = (bool)local_2d8.w._3_1_;
  opt_q.use_shader_pack8 = (bool)(undefined1)local_2d8.dims;
  opt_q.use_subgroup_basic = (bool)local_2d8.dims._1_1_;
  opt_q.use_subgroup_vote = (bool)local_2d8.dims._2_1_;
  opt_q.use_subgroup_ballot = (bool)local_2d8.dims._3_1_;
  opt_q.use_local_pool_allocator = (bool)(undefined1)local_2d8.d;
  opt_q.use_shader_local_memory = (bool)local_2d8.d._1_1_;
  opt_q.use_cooperative_matrix = (bool)local_2d8.d._2_1_;
  opt_q.use_winograd23_convolution = (bool)local_2d8.d._3_1_;
  opt_q.flush_denormals = local_2d8.h;
  opt_q._60_4_ = OVar17._60_4_;
  opt_q.use_winograd43_convolution = (bool)(undefined1)local_2d8.c;
  opt_q.use_winograd63_convolution = (bool)local_2d8.c._1_1_;
  opt_q.use_reserved_6 = (bool)local_2d8.c._2_1_;
  opt_q.use_reserved_7 = (bool)local_2d8.c._3_1_;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  local_330 = uVar23 & 0xffffffff;
  uVar49 = local_330;
  uVar35 = uVar23;
  if ((int)uVar26 < iVar32) {
    _top_rescale = *(void **)opt;
    pAStack_258 = opt->workspace_allocator;
    iStack_250 = opt->openmp_blocktime;
    unique0x10001bc4 = opt->use_winograd_convolution;
    unique0x10001bc5 = opt->use_sgemm_convolution;
    unique0x10001bc6 = opt->use_int8_inference;
    unique0x10001bc7 = opt->use_vulkan_compute;
    pAStack_248 = *(Allocator **)&opt->use_bf16_storage;
    _iStack_240 = *(undefined8 *)&opt->use_shader_pack8;
    _iStack_238 = *(undefined8 *)&opt->flush_denormals;
    _iStack_230 = *(undefined8 *)&opt->use_winograd43_convolution;
    pAStack_260 = opt->workspace_allocator;
    convert_packing(&local_2d8,(Mat *)&opt_q,uVar26,(Option *)&top_rescale);
    uVar35 = uVar23 & 0xffffffff;
  }
  piVar3 = top_blob->refcount;
  _top_rescale = top_blob->data;
  pAStack_260 = (Allocator *)top_blob->refcount;
  pAStack_258 = (Allocator *)top_blob->elemsize;
  iStack_250 = top_blob->elempack;
  pAStack_248 = top_blob->allocator;
  iStack_240 = top_blob->dims;
  iStack_23c = top_blob->w;
  iStack_238 = top_blob->h;
  iStack_234 = top_blob->d;
  iStack_230 = top_blob->c;
  local_228 = top_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (uVar27 < _elempack) {
    local_310 = (byte)uVar53;
    Mat::create((Mat *)&top_rescale,iVar31,iVar45,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3])
                / (int)uVar27,(ulong)((byte)((ushort)uVar36 / (ushort)local_310) * uVar27),uVar27,
                opt->workspace_allocator);
    uVar35 = uVar23 & 0xffffffff;
    iVar34 = -100;
    if ((_top_rescale != (void *)0x0) && ((long)iStack_230 * local_228 != 0)) goto LAB_003deffd;
  }
  else {
LAB_003deffd:
    iVar48 = 0;
    iVar31 = 0;
    for (lVar40 = 0; OVar17 = opt_q,
        lVar40 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]
                         ); lVar40 = lVar40 + 1) {
      local_180 = (int)uVar35 / (int)uVar26;
      _scale_out = (void *)((long)(iVar48 / (int)uVar26) * sVar7 * (long)opt_q.workspace_allocator +
                           opt_q._0_8_);
      local_1b0 = (int *)0x0;
      local_1a8 = opt_q.workspace_allocator;
      local_1a0 = opt_q.openmp_blocktime;
      local_198 = (long *)opt_q._32_8_;
      uVar16 = opt_q._40_8_;
      uVar10 = opt_q._48_8_;
      local_178 = ((long)(int)opt_q._52_4_ * (long)opt_q.workspace_allocator *
                   (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_ + 0xfU & 0xfffffffffffffff0
                  ) / (ulong)opt_q.workspace_allocator;
      opt_q.use_shader_pack8 = SUB81(uVar16,0);
      opt_q.use_subgroup_basic = SUB81(uVar16,1);
      opt_q.use_subgroup_vote = SUB81(uVar16,2);
      opt_q.use_subgroup_ballot = SUB81(uVar16,3);
      opt_q.use_subgroup_shuffle = SUB81(uVar16,4);
      opt_q.use_image_storage = SUB81(uVar16,5);
      opt_q.use_tensor_storage = SUB81(uVar16,6);
      opt_q.use_reserved_0 = SUB81(uVar16,7);
      local_190 = opt_q.use_shader_pack8;
      bStack_18f = opt_q.use_subgroup_basic;
      bStack_18e = opt_q.use_subgroup_vote;
      bStack_18d = opt_q.use_subgroup_ballot;
      bStack_18c = opt_q.use_subgroup_shuffle;
      bStack_18b = opt_q.use_image_storage;
      bStack_18a = opt_q.use_tensor_storage;
      bStack_189 = opt_q.use_reserved_0;
      opt_q.flush_denormals = (int)uVar10;
      opt_q.use_local_pool_allocator = SUB81(uVar10,4);
      opt_q.use_shader_local_memory = SUB81(uVar10,5);
      opt_q.use_cooperative_matrix = SUB81(uVar10,6);
      opt_q.use_winograd23_convolution = SUB81(uVar10,7);
      iStack_188 = opt_q.flush_denormals;
      bStack_184 = opt_q.use_local_pool_allocator;
      bStack_183 = opt_q.use_shader_local_memory;
      bStack_182 = opt_q.use_cooperative_matrix;
      bStack_181 = opt_q.use_winograd23_convolution;
      m_1.data = (void *)((long)(iVar31 / (int)uVar27) * local_228 * (long)pAStack_258 +
                         (long)_top_rescale);
      m_1.refcount = (int *)0x0;
      m_1.elemsize = (size_t)pAStack_258;
      m_1.elempack = iStack_250;
      m_1.allocator = pAStack_248;
      m_1.c = (int)((long)((ulong)(uint)((int)uVar52 >> 0x1f) << 0x20 | uVar52 & 0xffffffff) /
                   (long)(int)uVar27);
      m_1.cstep = ((long)iStack_234 * (long)pAStack_258 * (long)iStack_238 * (long)iStack_23c + 0xfU
                  & 0xfffffffffffffff0) / (ulong)pAStack_258;
      m_1.dims = iStack_240;
      m_1.w = iStack_23c;
      m_1.h = iStack_238;
      m_1.d = iStack_234;
      pLVar6 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar40];
      opt_g.lightmode = opt->lightmode;
      opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_g.num_threads = opt->num_threads;
      opt_g.workspace_allocator = opt->workspace_allocator;
      opt_g.openmp_blocktime = opt->openmp_blocktime;
      opt_g.use_winograd_convolution = opt->use_winograd_convolution;
      opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_g.use_int8_inference = opt->use_int8_inference;
      opt_g.use_vulkan_compute = opt->use_vulkan_compute;
      opt_g.use_bf16_storage = opt->use_bf16_storage;
      opt_g.use_fp16_packed = opt->use_fp16_packed;
      opt_g.use_fp16_storage = opt->use_fp16_storage;
      opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_g.use_int8_packed = opt->use_int8_packed;
      opt_g.use_int8_storage = opt->use_int8_storage;
      opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_g.use_packing_layout = opt->use_packing_layout;
      opt_g.use_shader_pack8 = opt->use_shader_pack8;
      opt_g.use_subgroup_basic = opt->use_subgroup_basic;
      opt_g.use_subgroup_vote = opt->use_subgroup_vote;
      opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_g.use_image_storage = opt->use_image_storage;
      opt_g.use_tensor_storage = opt->use_tensor_storage;
      opt_g.use_reserved_0 = opt->use_reserved_0;
      opt_g.flush_denormals = opt->flush_denormals;
      opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_g.use_shader_local_memory = opt->use_shader_local_memory;
      opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_g.use_reserved_6 = opt->use_reserved_6;
      opt_g.use_reserved_7 = opt->use_reserved_7;
      opt_g.use_reserved_8 = opt->use_reserved_8;
      opt_g.use_reserved_9 = opt->use_reserved_9;
      opt_g.use_reserved_10 = opt->use_reserved_10;
      opt_g.use_reserved_11 = opt->use_reserved_11;
      opt_g.blob_allocator = pAStack_248;
      opt_q = OVar17;
      (*pLVar6->_vptr_Layer[7])(pLVar6,&scale_out,&m_1,&opt_g);
      local_330._0_4_ = (int)uVar23;
      if (m_1.refcount != (int *)0x0) {
        LOCK();
        *m_1.refcount = *m_1.refcount + -1;
        UNLOCK();
        if (*m_1.refcount == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (local_1b0 != (int *)0x0) {
        LOCK();
        *local_1b0 = *local_1b0 + -1;
        UNLOCK();
        if (*local_1b0 == 0) {
          if (local_198 == (long *)0x0) {
            free(_scale_out);
          }
          else {
            (**(code **)(*local_198 + 0x18))();
          }
        }
      }
      iVar31 = iVar31 + (int)uVar52;
      iVar48 = iVar48 + (int)local_330;
      uVar35 = uVar49;
    }
    iVar34 = 0;
    if (uVar27 < _elempack) {
      convert_packing((Mat *)&top_rescale,top_blob,_elempack,opt);
    }
    else if ((Mat *)&top_rescale != top_blob) {
      if (pAStack_260 != (Allocator *)0x0) {
        LOCK();
        *(int *)&pAStack_260->_vptr_Allocator = *(int *)&pAStack_260->_vptr_Allocator + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            free(top_blob->data);
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->data = _top_rescale;
      top_blob->refcount = (int *)pAStack_260;
      top_blob->elemsize = (size_t)pAStack_258;
      top_blob->elempack = iStack_250;
      top_blob->allocator = pAStack_248;
      top_blob->dims = iStack_240;
      top_blob->w = iStack_23c;
      top_blob->h = iStack_238;
      top_blob->d = iStack_234;
      top_blob->c = iStack_230;
      top_blob->cstep = local_228;
    }
  }
  if (pAStack_260 != (Allocator *)0x0) {
    LOCK();
    *(int *)&pAStack_260->_vptr_Allocator = *(int *)&pAStack_260->_vptr_Allocator + -1;
    UNLOCK();
    if (*(int *)&pAStack_260->_vptr_Allocator == 0) {
      if (pAStack_248 == (Allocator *)0x0) {
        free(_top_rescale);
      }
      else {
        (*pAStack_248->_vptr_Allocator[3])();
      }
    }
  }
  if (opt_q.blob_allocator != (Allocator *)0x0) {
    LOCK();
    *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
         *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
    UNLOCK();
    if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
      if (opt_q._32_8_ == 0) {
        free((void *)opt_q._0_8_);
      }
      else {
        (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
      }
    }
  }
LAB_003e0384:
  piVar3 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_2d8.allocator == (Allocator *)0x0) {
        free(local_2d8.data);
      }
      else {
        (*(local_2d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_168.refcount != (int *)0x0) {
    LOCK();
    *local_168.refcount = *local_168.refcount + -1;
    UNLOCK();
    if (*local_168.refcount == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        free(local_168.data);
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar34;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}